

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall
lumeview::Renderer::add_stage
          (Renderer *this,string *name,SPMesh *mesh,GrobSet grobSet,ShadingPreset shading)

{
  int iVar1;
  element_type *peVar2;
  _Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_> _Var3;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  string *psVar7;
  LumeviewError *pLVar8;
  GrobSet grobSet_local;
  string local_270;
  Stage local_250;
  stringstream ss;
  ostream local_1a0 [376];
  
  grobSet_local = grobSet;
  bVar4 = lume::Mesh::has((mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          grobSet);
  if (!bVar4) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar6 = std::operator<<(local_1a0,"Requested grob type \'");
    psVar7 = lume::GrobSet::name_abi_cxx11_(&grobSet_local);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,"\' is not provided by the specified mesh.");
    pLVar8 = (LumeviewError *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    LumeviewError::LumeviewError(pLVar8,&local_250.name);
    __cxa_throw(pLVar8,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
  }
  Stage::Stage(&local_250);
  std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_250.mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>,
             &mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
  iVar1 = *(int *)(lume::impl::GROB_SET_DESCS + (ulong)grobSet.m_offset * 4);
  if (1 < iVar1 - 2U) {
    if (iVar1 == 1) {
      local_250.primType = 1;
      local_250.color.field_0._0_8_ = 0x3e4ccccd3e4ccccd;
      local_250.color.field_0._8_8_ = 0x3f0000003f800000;
      local_250.zfacNear = 0.99;
      local_250.zfacFar = 1.0;
      _Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
           ((mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_grobArrays
           [1]._M_t.super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>.
           _M_t.super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
           super__Head_base<0UL,_lume::GrobArray_*,_false>;
      if (_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl == (GrobArray *)0x0) {
        local_250.numInds = 0;
      }
      else {
        local_250.numInds =
             (GLsizei)((ulong)(*(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>
                                               ._M_head_impl + 0x18) -
                              *(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                              _M_head_impl + 0x10)) >> 2);
        local_250.color.field_0._0_8_ = 0x3e4ccccd3e4ccccd;
        local_250.color.field_0._8_8_ = 0x3f0000003f800000;
      }
      goto LAB_001479d5;
    }
    if (iVar1 != 9) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::operator<<(local_1a0,
                      "Renderer::add_stage: Unsupported grid object type in specified mesh.");
      pLVar8 = (LumeviewError *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      LumeviewError::LumeviewError(pLVar8,&local_270);
      __cxa_throw(pLVar8,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
    }
  }
  local_250.primType = 4;
  local_250.color.field_0._0_8_ = 0x3f8000003f800000;
  local_250.color.field_0._8_8_ = 0x3f8000003f800000;
  local_250.zfacNear = 1.0;
  local_250.zfacFar = 1.0;
  peVar2 = (mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
       peVar2->m_grobArrays[2]._M_t.
       super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>._M_t.
       super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
       super__Head_base<0UL,_lume::GrobArray_*,_false>;
  uVar5 = 0;
  local_250.numInds = 0;
  if (_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl != (GrobArray *)0x0) {
    local_250.numInds =
         (GLsizei)((ulong)(*(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                           _M_head_impl + 0x18) -
                          *(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                          _M_head_impl + 0x10)) >> 2);
  }
  _Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
       peVar2->m_grobArrays[3]._M_t.
       super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>._M_t.
       super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
       super__Head_base<0UL,_lume::GrobArray_*,_false>;
  if (_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl != (GrobArray *)0x0) {
    uVar5 = (uint)((int)((ulong)(*(long *)((long)_Var3.
                                                 super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                                 _M_head_impl + 0x18) -
                                *(long *)((long)_Var3.
                                                super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                                _M_head_impl + 0x10)) >> 2) * 3) >> 1;
  }
  local_250.numInds = uVar5 + local_250.numInds;
LAB_001479d5:
  local_250.shadingPreset = shading;
  std::__cxx11::string::operator=((string *)&local_250,(string *)name);
  local_250.grobSet.m_offset = grobSet.m_offset;
  std::vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>::
  emplace_back<lumeview::Renderer::Stage>(&this->m_stages,&local_250);
  Stage::~Stage(&local_250);
  return;
}

Assistant:

void Renderer::
add_stage (	std::string name,
            SPMesh mesh,
            const GrobSet grobSet,
            ShadingPreset shading)
{
	COND_THROW (!mesh->has (grobSet),
	            "Requested grob type '" << grobSet.name()
	            << "' is not provided by the specified mesh.");

	Stage newStage;
	newStage.mesh = mesh;

	switch (grobSet.type()) {
		case EDGES:
			newStage.primType = GL_LINES;
			newStage.color = glm::vec4 (0.2f, 0.2f, 1.0f, 0.5f);
			newStage.zfacNear = 0.99f;
			newStage.zfacFar = 1.f;
			newStage.numInds = mesh->num_indices (EDGE);
			break;
		
		case TRIS:
		case QUADS:
		case FACES:
			newStage.primType = GL_TRIANGLES;
			newStage.color = glm::vec4 (1.0f, 1.0f, 1.0f, 1.0f);
			newStage.zfacNear = 1.0f;
			newStage.zfacFar = 1.0f;
			newStage.numInds = mesh->num_indices(TRI)
					 		 + 3 * mesh->num_indices(QUAD) / 2;
			break;
		default:
			THROW("Renderer::add_stage: Unsupported grid object type in specified mesh.");
	}

	newStage.shadingPreset = shading;
	newStage.name = std::move (name);
	newStage.grobSet = grobSet;
	m_stages.push_back (std::move(newStage));
}